

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O0

Kind anon_unknown.dwarf_1e10c2::publicToInternalBuildKeyKind(llb_build_key_kind_t kind)

{
  code *pcVar1;
  Kind local_c;
  llb_build_key_kind_t kind_local;
  
  switch(kind) {
  case llb_build_key_kind_command:
    local_c = Command;
    break;
  case llb_build_key_kind_custom_task:
    local_c = CustomTask;
    break;
  case llb_build_key_kind_directory_contents:
    local_c = DirectoryContents;
    break;
  case llb_build_key_kind_directory_tree_signature:
    local_c = DirectoryTreeSignature;
    break;
  case llb_build_key_kind_node:
    local_c = Node;
    break;
  case llb_build_key_kind_target:
    local_c = Target;
    break;
  case llb_build_key_kind_unknown:
    local_c = Unknown;
    break;
  case llb_build_key_kind_directory_tree_structure_signature:
    local_c = DirectoryTreeStructureSignature;
    break;
  case llb_build_key_kind_filtered_directory_contents:
    local_c = FilteredDirectoryContents;
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case llb_build_key_kind_stat:
    local_c = Stat;
  }
  return local_c;
}

Assistant:

static BuildKey::Kind publicToInternalBuildKeyKind(llb_build_key_kind_t kind) {
    switch (kind) {
    case llb_build_key_kind_command:
      return BuildKey::Kind::Command;
    case llb_build_key_kind_custom_task:
      return BuildKey::Kind::CustomTask;
    case llb_build_key_kind_directory_contents:
      return BuildKey::Kind::DirectoryContents;
    case llb_build_key_kind_directory_tree_signature:
      return BuildKey::Kind::DirectoryTreeSignature;
    case llb_build_key_kind_node:
      return BuildKey::Kind::Node;
    case llb_build_key_kind_target:
      return BuildKey::Kind::Target;
    case llb_build_key_kind_unknown:
      return BuildKey::Kind::Unknown;
    case llb_build_key_kind_directory_tree_structure_signature:
      return BuildKey::Kind::DirectoryTreeStructureSignature;
    case llb_build_key_kind_filtered_directory_contents:
      return BuildKey::Kind::FilteredDirectoryContents;
    case llb_build_key_kind_stat:
      return BuildKey::Kind::Stat;
  }
}